

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O2

exr_result_t exr_get_file_name(exr_const_context_t_conflict ctxt,char **name)

{
  exr_result_t eVar1;
  
  if (ctxt == (exr_const_context_t_conflict)0x0) {
    eVar1 = 2;
  }
  else {
    if (name == (char **)0x0) {
      eVar1 = (*ctxt->standard_error)(ctxt,3);
      return eVar1;
    }
    *name = (ctxt->filename).str;
    eVar1 = 0;
    if (ctxt->mode == '\x01') {
      pthread_mutex_unlock((pthread_mutex_t *)&ctxt->mutex);
    }
  }
  return eVar1;
}

Assistant:

exr_result_t
exr_get_file_name (exr_const_context_t ctxt, const char** name)
{
    if (!ctxt) return EXR_ERR_MISSING_CONTEXT_ARG;

    /* not changeable after construction, no locking needed */
    if (name)
    {
        *name = ctxt->filename.str;
        if (ctxt->mode == EXR_CONTEXT_WRITE) internal_exr_unlock (ctxt);
        return EXR_ERR_SUCCESS;
    }

    return ctxt->standard_error (ctxt, EXR_ERR_INVALID_ARGUMENT);
}